

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O2

REF_STATUS ref_export_tec_surf_zone(REF_GRID ref_grid,FILE *file)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  REF_STATUS RVar5;
  long lVar6;
  undefined8 uVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  uint local_ec;
  REF_INT nnode;
  REF_DICT ref_dict;
  REF_INT *g2l;
  REF_INT nface;
  REF_NODE local_c0;
  REF_INT *l2g;
  long local_b0;
  REF_INT nodes [27];
  
  pRVar1 = ref_grid->node;
  uVar4 = ref_dict_create(&ref_dict);
  if (uVar4 == 0) {
    pRVar2 = ref_grid->cell[3];
    local_c0 = pRVar1;
    for (iVar8 = 0; iVar8 < pRVar2->max; iVar8 = iVar8 + 1) {
      RVar5 = ref_cell_nodes(pRVar2,iVar8,nodes);
      if ((RVar5 == 0) && (uVar4 = ref_dict_store(ref_dict,nodes[pRVar2->node_per],-1), uVar4 != 0))
      {
        pcVar9 = "mark tri";
        uVar7 = 0x19b;
        goto LAB_001605d6;
      }
    }
    pRVar2 = ref_grid->cell[6];
    for (iVar8 = 0; iVar8 < pRVar2->max; iVar8 = iVar8 + 1) {
      RVar5 = ref_cell_nodes(pRVar2,iVar8,nodes);
      if ((RVar5 == 0) && (uVar4 = ref_dict_store(ref_dict,nodes[pRVar2->node_per],-1), uVar4 != 0))
      {
        pcVar9 = "mark qua";
        uVar7 = 0x1a0;
        goto LAB_001605d6;
      }
    }
    iVar8 = ref_dict->n;
    local_ec = 0xffffffff;
    if (0 < iVar8) {
      local_ec = *ref_dict->key;
    }
    lVar10 = 0;
    while (pRVar1 = local_c0, lVar10 < iVar8) {
      local_b0 = lVar10;
      uVar4 = ref_grid_tri_qua_id_nodes(ref_grid,local_ec,&nnode,&nface,&g2l,&l2g);
      if (uVar4 != 0) {
        pcVar9 = "extract this boundary";
        uVar7 = 0x1a5;
        goto LAB_001605d6;
      }
      fprintf((FILE *)file,"zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
              ,(ulong)local_ec,(ulong)(uint)nnode,(ulong)(uint)nface,"point","fequadrilateral");
      for (lVar10 = 0; lVar10 < nnode; lVar10 = lVar10 + 1) {
        pRVar3 = pRVar1->real;
        lVar6 = (long)l2g[lVar10];
        fprintf((FILE *)file," %.16e %.16e %.16e\n",pRVar3[lVar6 * 0xf],pRVar3[lVar6 * 0xf + 1],
                pRVar3[lVar6 * 0xf + 2]);
      }
      pRVar2 = ref_grid->cell[3];
      for (iVar8 = 0; iVar8 < pRVar2->max; iVar8 = iVar8 + 1) {
        RVar5 = ref_cell_nodes(pRVar2,iVar8,nodes);
        if ((RVar5 == 0) && (local_ec == nodes[pRVar2->node_per])) {
          nodes[3] = nodes[2];
          for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
            fprintf((FILE *)file," %d",(ulong)(g2l[nodes[lVar10]] + 1));
          }
          fputc(10,(FILE *)file);
        }
      }
      pRVar2 = ref_grid->cell[6];
      for (iVar8 = 0; iVar8 < pRVar2->max; iVar8 = iVar8 + 1) {
        RVar5 = ref_cell_nodes(pRVar2,iVar8,nodes);
        if ((RVar5 == 0) && (local_ec == nodes[pRVar2->node_per])) {
          for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
            fprintf((FILE *)file," %d",(ulong)(g2l[nodes[lVar10]] + 1));
          }
          fputc(10,(FILE *)file);
        }
      }
      free(l2g);
      free(g2l);
      lVar10 = local_b0 + 1;
      iVar8 = ref_dict->n;
      local_ec = 0xffffffff;
      if ((int)lVar10 < iVar8) {
        local_ec = ref_dict->key[local_b0 + 1];
      }
    }
    uVar4 = ref_dict_free(ref_dict);
    if (uVar4 == 0) {
      return 0;
    }
    pcVar9 = "free dict";
    uVar7 = 0x1ca;
  }
  else {
    pcVar9 = "create dict";
    uVar7 = 0x196;
  }
LAB_001605d6:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar7,
         "ref_export_tec_surf_zone",(ulong)uVar4,pcVar9);
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_export_tec_surf_zone(REF_GRID ref_grid,
                                                   FILE *file) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *g2l, *l2g;
  REF_INT nface;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnode;
  REF_DICT ref_dict;
  REF_INT boundary_tag, boundary_index;

  ref_node = ref_grid_node(ref_grid);

  RSS(ref_dict_create(&ref_dict), "create dict");

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) RSS(
      ref_dict_store(ref_dict, nodes[ref_cell_id_index(ref_cell)], REF_EMPTY),
      "mark tri");

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) RSS(
      ref_dict_store(ref_dict, nodes[ref_cell_id_index(ref_cell)], REF_EMPTY),
      "mark qua");

  each_ref_dict_key(ref_dict, boundary_index, boundary_tag) {
    RSS(ref_grid_tri_qua_id_nodes(ref_grid, boundary_tag, &nnode, &nface, &g2l,
                                  &l2g),
        "extract this boundary");

    fprintf(file,
            "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            boundary_tag, nnode, nface, "point", "fequadrilateral");

    for (node = 0; node < nnode; node++)
      fprintf(file, " %.16e %.16e %.16e\n",
              ref_node_xyz(ref_node, 0, l2g[node]),
              ref_node_xyz(ref_node, 1, l2g[node]),
              ref_node_xyz(ref_node, 2, l2g[node]));

    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (boundary_tag == nodes[ref_cell_id_index(ref_cell)]) {
        nodes[3] = nodes[2];
        for (node = 0; node < 4; node++) {
          fprintf(file, " %d", g2l[nodes[node]] + 1);
        }
        fprintf(file, "\n");
      }
    }

    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (boundary_tag == nodes[ref_cell_id_index(ref_cell)]) {
        for (node = 0; node < 4; node++)
          fprintf(file, " %d", g2l[nodes[node]] + 1);
        fprintf(file, "\n");
      }
    }

    ref_free(l2g);
    ref_free(g2l);
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}